

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,void *dictStart,
              size_t dictSize)

{
  char *pcVar1;
  char *pcVar2;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  undefined8 uVar8;
  ushort uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  char cVar14;
  BYTE *d_1;
  char *pcVar15;
  ushort *__src;
  char *pcVar16;
  char *pcVar17;
  ushort *puVar18;
  ulong __n;
  BYTE *e;
  char *pcVar19;
  long lStack_b0;
  int local_a0;
  
  local_a0 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    lVar10 = (long)dictStart + dictSize;
    if (dictStart == (void *)0x0) {
      lVar10 = 0;
    }
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        local_a0 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar3 = (byte *)(source + compressedSize);
      pcVar4 = dest + (uint)maxOutputSize;
      pcVar1 = pcVar4 + -7;
      pcVar17 = dest;
      puVar18 = (ushort *)source;
LAB_00114abd:
      uVar11 = 0xf;
      __src = (ushort *)((long)puVar18 + 1);
      bVar5 = (byte)*puVar18;
      uVar13 = (ulong)(uint)(bVar5 >> 4);
      if (bVar5 >> 4 == 0xf) {
        lStack_b0 = -1;
        if (__src < pbVar3 + -0xf) {
          lStack_b0 = 0;
          puVar18 = puVar18 + 1;
          do {
            __src = puVar18;
            if (pbVar3 + -0xf < __src) {
              lStack_b0 = -1;
              break;
            }
            lStack_b0 = lStack_b0 + (ulong)*(byte *)((long)__src + -1);
            puVar18 = (ushort *)((long)__src + 1);
          } while ((ulong)*(byte *)((long)__src + -1) == 0xff);
        }
        cVar14 = '\x05';
        if (lStack_b0 != -1) {
          uVar11 = lStack_b0 + 0xf;
          if (CARRY8((ulong)pcVar17,uVar11)) {
            cVar14 = '\x05';
          }
          else {
            cVar14 = CARRY8((ulong)__src,uVar11) * '\x05';
          }
        }
        uVar13 = uVar11;
        if (cVar14 != '\0') goto LAB_00114e55;
LAB_00114b39:
        pcVar15 = pcVar17 + uVar13;
        if ((pcVar4 + -0xc < pcVar15) ||
           (puVar18 = (ushort *)((long)__src + uVar13), pbVar3 + -8 < puVar18)) {
          if (((byte *)((long)__src + uVar13) == pbVar3) && (pcVar15 <= pcVar4)) {
            memmove(pcVar17,__src,uVar13);
            return (int)pcVar15 - (int)dest;
          }
          goto LAB_00114e80;
        }
        do {
          *(undefined8 *)pcVar17 = *(undefined8 *)__src;
          pcVar17 = pcVar17 + 8;
          __src = __src + 4;
        } while (pcVar17 < pcVar15);
        uVar6 = *puVar18;
        __src = puVar18 + 1;
        pcVar12 = pcVar15 + -(ulong)uVar6;
        uVar11 = (ulong)(bVar5 & 0xf);
      }
      else {
        if ((source + (long)compressedSize + -0x10 <= __src) ||
           (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar17)) goto LAB_00114b39;
        uVar8 = *(undefined8 *)((long)puVar18 + 9);
        *(undefined8 *)pcVar17 = *(undefined8 *)__src;
        *(undefined8 *)(pcVar17 + 8) = uVar8;
        pcVar15 = pcVar17 + uVar13;
        uVar11 = (ulong)(bVar5 & 0xf);
        puVar18 = (ushort *)((long)__src + uVar13);
        __src = puVar18 + 1;
        uVar6 = *puVar18;
        pcVar12 = pcVar15 + -(ulong)uVar6;
        if ((uVar11 != 0xf) && ((7 < uVar6 && (dest <= pcVar12)))) {
          *(undefined8 *)pcVar15 = *(undefined8 *)pcVar12;
          *(undefined8 *)(pcVar15 + 8) = *(undefined8 *)(pcVar12 + 8);
          *(undefined2 *)(pcVar15 + 0x10) = *(undefined2 *)(pcVar12 + 0x10);
          pcVar17 = pcVar15 + uVar11 + 4;
          puVar18 = __src;
          goto LAB_00114abd;
        }
      }
      if ((int)uVar11 == 0xf) {
        lStack_b0 = 0;
        puVar18 = __src;
        do {
          __src = (ushort *)((long)puVar18 + 1);
          if (pbVar3 + -4 < __src) {
            lStack_b0 = -1;
            break;
          }
          uVar9 = *puVar18;
          lStack_b0 = lStack_b0 + (ulong)(byte)uVar9;
          puVar18 = __src;
        } while ((ulong)(byte)uVar9 == 0xff);
        uVar11 = lStack_b0 + 0xf;
        if ((lStack_b0 == -1) || (CARRY8((ulong)pcVar15,uVar11))) goto LAB_00114e80;
      }
      if ((dictSize < 0x10000) && (pcVar12 + dictSize < dest)) goto LAB_00114e80;
      uVar11 = uVar11 + 4;
      pcVar19 = pcVar15 + uVar11;
      pcVar17 = pcVar19;
      puVar18 = __src;
      if (pcVar12 < dest) {
        if (pcVar4 + -5 < pcVar19) goto LAB_00114e80;
        __n = (long)dest - (long)pcVar12;
        uVar13 = uVar11 - __n;
        if (uVar11 < __n || uVar13 == 0) {
          memmove(pcVar15,(void *)(lVar10 - __n),uVar11);
        }
        else {
          memcpy(pcVar15,(void *)(lVar10 - __n),__n);
          pcVar17 = pcVar15 + __n;
          if ((ulong)((long)pcVar17 - (long)dest) < uVar13) {
            pcVar15 = dest;
            if ((long)__n < (long)uVar11) {
              do {
                *pcVar17 = *pcVar15;
                pcVar17 = pcVar17 + 1;
                pcVar15 = pcVar15 + 1;
              } while (pcVar17 < pcVar19);
            }
          }
          else {
            memcpy(pcVar17,dest,uVar13);
            pcVar17 = pcVar19;
          }
        }
        goto LAB_00114abd;
      }
      if (uVar6 < 8) {
        pcVar15[0] = '\0';
        pcVar15[1] = '\0';
        pcVar15[2] = '\0';
        pcVar15[3] = '\0';
        *pcVar15 = *pcVar12;
        pcVar15[1] = pcVar12[1];
        pcVar15[2] = pcVar12[2];
        pcVar15[3] = pcVar12[3];
        uVar7 = inc32table[uVar6];
        *(undefined4 *)(pcVar15 + 4) = *(undefined4 *)(pcVar12 + uVar7);
        pcVar12 = pcVar12 + ((ulong)uVar7 - (long)dec64table[uVar6]);
      }
      else {
        *(undefined8 *)pcVar15 = *(undefined8 *)pcVar12;
        pcVar12 = pcVar12 + 8;
      }
      pcVar2 = pcVar15 + 8;
      if (pcVar19 <= pcVar4 + -0xc) {
        *(undefined8 *)pcVar2 = *(undefined8 *)pcVar12;
        if (0x10 < uVar11) {
          pcVar15 = pcVar15 + 0x10;
          do {
            pcVar12 = pcVar12 + 8;
            *(undefined8 *)pcVar15 = *(undefined8 *)pcVar12;
            pcVar15 = pcVar15 + 8;
          } while (pcVar15 < pcVar19);
        }
        goto LAB_00114abd;
      }
      cVar14 = '\x05';
      if (pcVar19 <= pcVar4 + -5) {
        pcVar15 = pcVar12;
        pcVar16 = pcVar2;
        if (pcVar2 < pcVar1) {
          do {
            *(undefined8 *)pcVar16 = *(undefined8 *)pcVar15;
            pcVar16 = pcVar16 + 8;
            pcVar15 = pcVar15 + 8;
          } while (pcVar16 < pcVar1);
          pcVar12 = pcVar12 + ((long)pcVar1 - (long)pcVar2);
          pcVar2 = pcVar1;
        }
        for (; cVar14 = '\0', pcVar2 < pcVar19; pcVar2 = pcVar2 + 1) {
          cVar14 = *pcVar12;
          pcVar12 = pcVar12 + 1;
          *pcVar2 = cVar14;
        }
      }
      if (cVar14 == '\0') goto LAB_00114abd;
LAB_00114e55:
      local_a0 = (int)__src;
      if (cVar14 == '\x05') {
LAB_00114e80:
        local_a0 = (int)source;
        local_a0 = ~(uint)__src + local_a0;
      }
    }
  }
  return local_a0;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int maxOutputSize,
                                     const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}